

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

sexp_conflict
sexp_utf8_next(sexp_conflict ctx,sexp_conflict self,sexp_conflict bv,sexp_conflict offset,
              sexp_conflict end)

{
  byte bVar1;
  sexp_conflict psVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  
  if ((((ulong)bv & 3) != 0) || (bv->tag != 8)) {
    psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,8,bv);
    return psVar2;
  }
  if (((ulong)offset & 1) == 0) {
    psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,2);
    return psVar2;
  }
  if (((ulong)end & 1) == 0) {
    psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,2,end);
    return psVar2;
  }
  lVar3 = (long)offset >> 1;
  psVar2 = (sexp_conflict)&DAT_0000003e;
  if (lVar3 < (long)end >> 1) {
    bVar1 = *(byte *)((long)&bv->value + lVar3 + 8);
    uVar5 = 1;
    if (0xbf < bVar1) {
      bVar4 = 2;
      if (0xdf < bVar1) {
        bVar4 = ((bVar1 >> 4 & 1) != 0) + 3;
      }
      uVar5 = (ulong)bVar4;
    }
    psVar2 = (sexp_conflict)&DAT_0000003e;
    if ((long)(uVar5 + lVar3) <= (long)end >> 1) {
      psVar2 = (sexp_conflict)((uVar5 + lVar3) * 2 + 1);
    }
  }
  return psVar2;
}

Assistant:

sexp sexp_utf8_next (sexp ctx, sexp self, sexp bv, sexp offset, sexp end) {
  sexp_sint_t initial, res;
  sexp_assert_type(ctx, sexp_bytesp, SEXP_BYTES, bv);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, offset);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, end);
  if (sexp_unbox_fixnum(offset) >= sexp_unbox_fixnum(end)) return SEXP_FALSE;
  initial = ((unsigned char*)sexp_bytes_data(bv) + sexp_unbox_fixnum(offset))[0];
  res = sexp_unbox_fixnum(offset) + (initial < 0xC0 ? 1 : initial < 0xE0 ? 2 : 3 + ((initial>>4)&1));
  return res > sexp_unbox_fixnum(end) ? SEXP_FALSE : sexp_make_fixnum(res);
}